

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv,char **envp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  char *__s;
  ostream *poVar8;
  string ENV;
  string ARCH;
  string OS;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90;
  char *local_88;
  char local_80;
  undefined7 uStack_7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = (char *)0x0;
  local_80 = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90 = &local_80;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (isWindows) {
    pcVar7 = getenv("OS");
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar7);
    pcVar7 = getenv("PROCESSOR_ARCHITECTURE");
    sVar4 = local_70._M_string_length;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)sVar4,(ulong)pcVar7);
    std::operator+(&local_b0,&local_50,&local_70);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0010252d;
  }
  pcVar7 = getenv("OSTYPE");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar7,&local_b1);
  iVar6 = std::__cxx11::string::compare((char *)&local_b0);
  paVar3 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 == 0) {
LAB_001024db:
    __s = getenv("MACHTYPE");
    pcVar7 = local_88;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,pcVar7,(ulong)__s);
  }
  else {
    pcVar7 = getenv("TERM_PROGRAM");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar7,&local_b1);
    iVar6 = std::__cxx11::string::compare((char *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (iVar6 == 0) {
      pcVar7 = "macOS/Mac OSX, x86-64/x64";
    }
    else {
      pcVar7 = getenv("OSTYPE");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar7,&local_b1);
      iVar6 = std::__cxx11::string::compare((char *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (iVar6 == 0) goto LAB_001024db;
      pcVar7 = "Unknown";
    }
    std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,(ulong)pcVar7);
  }
LAB_0010252d:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nNew Language Features & Language Changes in C++17 (http://bit.ly/Cplusplus17Ft) ~ Adrian D."
             ,0x5c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter \'exit\' at anytime to terminate the application.",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Env. ",5);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_90,(long)local_88);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  do {
    bVar5 = displayFtTypePrompt();
  } while (!bVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return 0;
}

Assistant:

int main (int argc, char* argv[], char* envp[]) {

	//ENV
	string ENV, OS, ARCH;

	//Windows
	if (isWindows) {
		OS = getenv("OS");
		ARCH = getenv("PROCESSOR_ARCHITECTURE");
		ENV = OS + ARCH;
	}
	//Linux
	else if (string(getenv("OSTYPE")).compare("linux") == 0) {
		ENV = getenv("MACHTYPE");
	}
	//Mac
	else if (string(getenv("TERM_PROGRAM")).compare("Apple_Terminal") == 0) {
		ENV = "macOS/Mac OSX, x86-64/x64";
	}
	//BSD
	else if (string(getenv("OSTYPE")).compare("bsd") == 0) {
		ENV = getenv("MACHTYPE");
	}
	//Unknown
	else
		ENV = "Unknown";

	//Prompt
	cout << "\nNew Language Features & Language Changes in C++17 (http://bit.ly/Cplusplus17Ft) ~ Adrian D." << endl;
	cout << "Enter 'exit' at anytime to terminate the application." << endl;
	cout << "Env. " << ENV << endl;
	
	//Display Prompts
	while (true) {
		if (displayFtTypePrompt())
			break;
	}

	return 0;
}